

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word2vec.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  double dVar2;
  int local_1c;
  int i;
  char **argv_local;
  int argc_local;
  
  if (argc == 1) {
    printf("WORD VECTOR estimation toolkit v 0.1c\n\n");
    printf("Options:\n");
    printf("Parameters for training:\n");
    printf("\t-train <file>\n");
    printf("\t\tUse text data from <file> to train the model\n");
    printf("\t-output <file>\n");
    printf("\t\tUse <file> to save the resulting word vectors / word clusters\n");
    printf("\t-size <int>\n");
    printf("\t\tSet size of word vectors; default is 100\n");
    printf("\t-window <int>\n");
    printf("\t\tSet max skip length between words; default is 5\n");
    printf("\t-sample <float>\n");
    printf(
          "\t\tSet threshold for occurrence of words. Those that appear with higher frequency in the training data\n"
          );
    printf("\t\twill be randomly down-sampled; default is 1e-3, useful range is (0, 1e-5)\n");
    printf("\t-hs <int>\n");
    printf("\t\tUse Hierarchical Softmax; default is 0 (not used)\n");
    printf("\t-negative <int>\n");
    printf(
          "\t\tNumber of negative examples; default is 5, common values are 3 - 10 (0 = not used)\n"
          );
    printf("\t-threads <int>\n");
    printf("\t\tUse <int> threads (default 12)\n");
    printf("\t-iter <int>\n");
    printf("\t\tRun more training iterations (default 5)\n");
    printf("\t-min-count <int>\n");
    printf("\t\tThis will discard words that appear less than <int> times; default is 5\n");
    printf("\t-alpha <float>\n");
    printf("\t\tSet the starting learning rate; default is 0.025 for skip-gram and 0.05 for CBOW\n")
    ;
    printf("\t-classes <int>\n");
    printf(
          "\t\tOutput word classes rather than word vectors; default number of classes is 0 (vectors are written)\n"
          );
    printf("\t-debug <int>\n");
    printf("\t\tSet the debug mode (default = 2 = more info during training)\n");
    printf("\t-binary <int>\n");
    printf("\t\tSave the resulting vectors in binary moded; default is 0 (off)\n");
    printf("\t-output-classifier <int>\n");
    printf("\t\tOutput the classifier (one vector or the hierarchy); default is 0 (off)\n");
    printf("\t-save-vocab <file>\n");
    printf("\t\tThe vocabulary will be saved to <file>\n");
    printf("\t-read-vocab <file>\n");
    printf("\t\tThe vocabulary will be read from <file>, not constructed from the training data\n");
    printf("\t-cbow <int>\n");
    printf("\t\tUse the continuous bag of words model; default is 1 (use 0 for skip-gram model)\n");
    printf("\nExamples:\n");
    printf(
          "./word2vec -train data.txt -output vec.txt -size 200 -window 5 -sample 1e-4 -negative 5 -hs 0 -binary 0 -cbow 1 -iter 3\n\n"
          );
  }
  else {
    output_file[0] = '\0';
    save_vocab_file[0] = '\0';
    read_vocab_file[0] = '\0';
    iVar1 = ArgPos("-size",argc,argv);
    if (0 < iVar1) {
      iVar1 = atoi(argv[iVar1 + 1]);
      layer1_size = (longlong)iVar1;
    }
    iVar1 = ArgPos("-train",argc,argv);
    if (0 < iVar1) {
      strcpy(train_file,argv[iVar1 + 1]);
    }
    iVar1 = ArgPos("-save-vocab",argc,argv);
    if (0 < iVar1) {
      strcpy(save_vocab_file,argv[iVar1 + 1]);
    }
    iVar1 = ArgPos("-read-vocab",argc,argv);
    if (0 < iVar1) {
      strcpy(read_vocab_file,argv[iVar1 + 1]);
    }
    iVar1 = ArgPos("-debug",argc,argv);
    if (0 < iVar1) {
      debug_mode = atoi(argv[iVar1 + 1]);
    }
    iVar1 = ArgPos("-binary",argc,argv);
    if (0 < iVar1) {
      binary = atoi(argv[iVar1 + 1]);
    }
    iVar1 = ArgPos("-output-classifier",argc,argv);
    if (0 < iVar1) {
      strcpy(output_classifier,argv[iVar1 + 1]);
    }
    iVar1 = ArgPos("-cbow",argc,argv);
    if (0 < iVar1) {
      cbow = atoi(argv[iVar1 + 1]);
    }
    if (cbow != 0) {
      alpha = 0.05;
    }
    iVar1 = ArgPos("-alpha",argc,argv);
    if (0 < iVar1) {
      dVar2 = atof(argv[iVar1 + 1]);
      alpha = (real)dVar2;
    }
    iVar1 = ArgPos("-output",argc,argv);
    if (0 < iVar1) {
      strcpy(output_file,argv[iVar1 + 1]);
    }
    iVar1 = ArgPos("-window",argc,argv);
    if (0 < iVar1) {
      window = atoi(argv[iVar1 + 1]);
    }
    iVar1 = ArgPos("-sample",argc,argv);
    if (0 < iVar1) {
      dVar2 = atof(argv[iVar1 + 1]);
      sample = (real)dVar2;
    }
    iVar1 = ArgPos("-hs",argc,argv);
    if (0 < iVar1) {
      hs = atoi(argv[iVar1 + 1]);
    }
    iVar1 = ArgPos("-negative",argc,argv);
    if (0 < iVar1) {
      negative = atoi(argv[iVar1 + 1]);
    }
    iVar1 = ArgPos("-threads",argc,argv);
    if (0 < iVar1) {
      num_threads = atoi(argv[iVar1 + 1]);
    }
    iVar1 = ArgPos("-iter",argc,argv);
    if (0 < iVar1) {
      iVar1 = atoi(argv[iVar1 + 1]);
      iter = (longlong)iVar1;
    }
    iVar1 = ArgPos("-min-count",argc,argv);
    if (0 < iVar1) {
      min_count = atoi(argv[iVar1 + 1]);
    }
    iVar1 = ArgPos("-classes",argc,argv);
    if (0 < iVar1) {
      iVar1 = atoi(argv[iVar1 + 1]);
      classes = (longlong)iVar1;
    }
    vocab = (vocab_word *)calloc(vocab_max_size,0x28);
    vocab_hash = (int *)calloc(30000000,4);
    expTable = (real *)malloc(0xfa4);
    for (local_1c = 0; local_1c < 1000; local_1c = local_1c + 1) {
      dVar2 = exp((double)(((float)local_1c / 1000.0 + (float)local_1c / 1000.0 + -1.0) * 6.0));
      expTable[local_1c] = (float)dVar2;
      expTable[local_1c] = expTable[local_1c] / (expTable[local_1c] + 1.0);
    }
    TrainModel();
    DestroyNet();
    free(vocab_hash);
    free(expTable);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv) {
  int i;
  if (argc == 1) {
    printf("WORD VECTOR estimation toolkit v 0.1c\n\n");
    printf("Options:\n");
    printf("Parameters for training:\n");
    printf("\t-train <file>\n");
    printf("\t\tUse text data from <file> to train the model\n");
    printf("\t-output <file>\n");
    printf("\t\tUse <file> to save the resulting word vectors / word clusters\n");
    printf("\t-size <int>\n");
    printf("\t\tSet size of word vectors; default is 100\n");
    printf("\t-window <int>\n");
    printf("\t\tSet max skip length between words; default is 5\n");
    printf("\t-sample <float>\n");
    printf("\t\tSet threshold for occurrence of words. Those that appear with higher frequency in the training data\n");
    printf("\t\twill be randomly down-sampled; default is 1e-3, useful range is (0, 1e-5)\n");
    printf("\t-hs <int>\n");
    printf("\t\tUse Hierarchical Softmax; default is 0 (not used)\n");
    printf("\t-negative <int>\n");
    printf("\t\tNumber of negative examples; default is 5, common values are 3 - 10 (0 = not used)\n");
    printf("\t-threads <int>\n");
    printf("\t\tUse <int> threads (default 12)\n");
    printf("\t-iter <int>\n");
    printf("\t\tRun more training iterations (default 5)\n");
    printf("\t-min-count <int>\n");
    printf("\t\tThis will discard words that appear less than <int> times; default is 5\n");
    printf("\t-alpha <float>\n");
    printf("\t\tSet the starting learning rate; default is 0.025 for skip-gram and 0.05 for CBOW\n");
    printf("\t-classes <int>\n");
    printf("\t\tOutput word classes rather than word vectors; default number of classes is 0 (vectors are written)\n");
    printf("\t-debug <int>\n");
    printf("\t\tSet the debug mode (default = 2 = more info during training)\n");
    printf("\t-binary <int>\n");
    printf("\t\tSave the resulting vectors in binary moded; default is 0 (off)\n");
    printf("\t-output-classifier <int>\n");
    printf("\t\tOutput the classifier (one vector or the hierarchy); default is 0 (off)\n");
    printf("\t-save-vocab <file>\n");
    printf("\t\tThe vocabulary will be saved to <file>\n");
    printf("\t-read-vocab <file>\n");
    printf("\t\tThe vocabulary will be read from <file>, not constructed from the training data\n");
    printf("\t-cbow <int>\n");
    printf("\t\tUse the continuous bag of words model; default is 1 (use 0 for skip-gram model)\n");
    printf("\nExamples:\n");
    printf("./word2vec -train data.txt -output vec.txt -size 200 -window 5 -sample 1e-4 -negative 5 -hs 0 -binary 0 -cbow 1 -iter 3\n\n");
    return 0;
  }
  output_file[0] = 0;
  save_vocab_file[0] = 0;
  read_vocab_file[0] = 0;
  if ((i = ArgPos((char *)"-size", argc, argv)) > 0) layer1_size = atoi(argv[i + 1]);
  if ((i = ArgPos((char *)"-train", argc, argv)) > 0) strcpy(train_file, argv[i + 1]);
  if ((i = ArgPos((char *)"-save-vocab", argc, argv)) > 0) strcpy(save_vocab_file, argv[i + 1]);
  if ((i = ArgPos((char *)"-read-vocab", argc, argv)) > 0) strcpy(read_vocab_file, argv[i + 1]);
  if ((i = ArgPos((char *)"-debug", argc, argv)) > 0) debug_mode = atoi(argv[i + 1]);
  if ((i = ArgPos((char *)"-binary", argc, argv)) > 0) binary = atoi(argv[i + 1]);
  if ((i = ArgPos((char *)"-output-classifier", argc, argv)) > 0) strcpy(output_classifier, argv[i + 1]);
  if ((i = ArgPos((char *)"-cbow", argc, argv)) > 0) cbow = atoi(argv[i + 1]);
  if (cbow) alpha = 0.05;
  if ((i = ArgPos((char *)"-alpha", argc, argv)) > 0) alpha = atof(argv[i + 1]);
  if ((i = ArgPos((char *)"-output", argc, argv)) > 0) strcpy(output_file, argv[i + 1]);
  if ((i = ArgPos((char *)"-window", argc, argv)) > 0) window = atoi(argv[i + 1]);
  if ((i = ArgPos((char *)"-sample", argc, argv)) > 0) sample = atof(argv[i + 1]);
  if ((i = ArgPos((char *)"-hs", argc, argv)) > 0) hs = atoi(argv[i + 1]);
  if ((i = ArgPos((char *)"-negative", argc, argv)) > 0) negative = atoi(argv[i + 1]);
  if ((i = ArgPos((char *)"-threads", argc, argv)) > 0) num_threads = atoi(argv[i + 1]);
  if ((i = ArgPos((char *)"-iter", argc, argv)) > 0) iter = atoi(argv[i + 1]);
  if ((i = ArgPos((char *)"-min-count", argc, argv)) > 0) min_count = atoi(argv[i + 1]);
  if ((i = ArgPos((char *)"-classes", argc, argv)) > 0) classes = atoi(argv[i + 1]);
  vocab = (struct vocab_word *)calloc(vocab_max_size, sizeof(struct vocab_word));
  vocab_hash = (int *)calloc(vocab_hash_size, sizeof(int));
  expTable = (real *)malloc((EXP_TABLE_SIZE + 1) * sizeof(real));
  for (i = 0; i < EXP_TABLE_SIZE; i++) {
    expTable[i] = exp((i / (real)EXP_TABLE_SIZE * 2 - 1) * MAX_EXP); // Precompute the exp() table
    expTable[i] = expTable[i] / (expTable[i] + 1);                   // Precompute f(x) = x / (x + 1)
  }
  TrainModel();
  DestroyNet();
  free(vocab_hash);
  free(expTable);
  return 0;
}